

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_scene_visuals.cxx
# Opt level: O0

void __thiscall xray_re::xr_visual_object::~xr_visual_object(xr_visual_object *this)

{
  xr_visual_object *this_local;
  
  ~xr_visual_object(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

xr_visual_object::~xr_visual_object() {}